

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Prs_ManWriteVerilogSignal(FILE *pFile,Prs_Ntk_t *p,int Sig)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Prs_ManType_t Type;
  int Value;
  int Sig_local;
  Prs_Ntk_t *p_local;
  FILE *pFile_local;
  
  iVar1 = Abc_Lit2Var2(Sig);
  iVar2 = Abc_Lit2Att2(Sig);
  if (iVar2 == 0) {
    pcVar3 = Prs_ObjGetName(p,iVar1);
    fprintf((FILE *)pFile,"%s",pcVar3);
  }
  else if (iVar2 == 2) {
    pcVar3 = Prs_NtkConst(p,iVar1);
    fprintf((FILE *)pFile,"%s",pcVar3);
  }
  else if (iVar2 == 1) {
    iVar2 = Prs_SliceName(p,iVar1);
    pcVar3 = Prs_ObjGetName(p,iVar2);
    iVar1 = Prs_SliceRange(p,iVar1);
    pcVar4 = Prs_ManWriteRange(p,iVar1,1);
    fprintf((FILE *)pFile,"%s%s",pcVar3,pcVar4);
  }
  else {
    if (iVar2 != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                    ,0xbd,"void Prs_ManWriteVerilogSignal(FILE *, Prs_Ntk_t *, int)");
    }
    Prs_ManWriteVerilogConcat(pFile,p,iVar1);
  }
  return;
}

Assistant:

static void Prs_ManWriteVerilogSignal( FILE * pFile, Prs_Ntk_t * p, int Sig )
{
    int Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == CBA_PRS_NAME )
        fprintf( pFile, "%s", Prs_ObjGetName(p, Value) );
    else if ( Type == CBA_PRS_CONST )
        fprintf( pFile, "%s", Prs_NtkConst(p, Value) );
    else if ( Type == CBA_PRS_SLICE )
        fprintf( pFile, "%s%s", Prs_ObjGetName(p, Prs_SliceName(p, Value)), Prs_ManWriteRange(p, Prs_SliceRange(p, Value), 1) );
    else if ( Type == CBA_PRS_CONCAT )
        Prs_ManWriteVerilogConcat( pFile, p, Value );
    else assert( 0 );
}